

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int limit;
  int iVar2;
  unsigned_long_long uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  undefined4 in_register_0000003c;
  string *psVar6;
  allocator local_61;
  string local_60;
  string command;
  
  psVar6 = (string *)CONCAT44(in_register_0000003c,argc);
  if (1 < argc) {
    std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&local_60);
    bVar1 = std::operator==(&command,"pattern");
    if (bVar1) {
      if (argc != 2) {
        std::__cxx11::string::string((string *)&local_60,argv[2],&local_61);
        uVar3 = std::__cxx11::stoull(&local_60,(size_t *)0x0,10);
        std::__cxx11::string::_M_dispose();
        if ((uint)argc < 4) {
          uVar4 = 1;
        }
        else {
          std::__cxx11::string::string((string *)&local_60,argv[3],&local_61);
          uVar4 = std::__cxx11::stoull(&local_60,(size_t *)0x0,10);
          std::__cxx11::string::_M_dispose();
        }
        ListPatterns(uVar3,uVar4);
        goto LAB_0010318b;
      }
    }
    else {
      bVar1 = std::operator==(&command,"count_grids");
      if (bVar1) {
        if (argc == 4) {
          std::__cxx11::string::string((string *)&local_60,argv[2],&local_61);
          iVar2 = std::__cxx11::stoi(&local_60,(size_t *)0x0,10);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::string((string *)&local_60,argv[3],&local_61);
          limit = std::__cxx11::stoi(&local_60,(size_t *)0x0,10);
          std::__cxx11::string::_M_dispose();
          CountGrids(iVar2,limit);
          goto LAB_0010318b;
        }
      }
      else {
        bVar1 = std::operator==(&command,"make_tables");
        if (bVar1) {
          MakeTables();
          goto LAB_0010318b;
        }
        bVar1 = std::operator==(&command,"list_grids");
        if (bVar1) {
          if (argc != 2) {
            std::__cxx11::string::string((string *)&local_60,argv[2],&local_61);
            uVar3 = std::__cxx11::stoull(&local_60,(size_t *)0x0,10);
            std::__cxx11::string::_M_dispose();
            if ((uint)argc < 4) {
              uVar4 = 1;
            }
            else {
              std::__cxx11::string::string((string *)&local_60,argv[3],&local_61);
              uVar4 = std::__cxx11::stoull(&local_60,(size_t *)0x0,10);
              std::__cxx11::string::_M_dispose();
            }
            ListGrids(uVar3,uVar4);
            goto LAB_0010318b;
          }
        }
        else {
          bVar1 = std::operator==(&command,"sample_grids");
          if (bVar1) {
            if (argc == 2) {
              iVar5 = -1;
            }
            else {
              std::__cxx11::string::string((string *)&local_60,argv[2],&local_61);
              iVar5 = std::__cxx11::stoll(&local_60,(size_t *)0x0,10);
              std::__cxx11::string::_M_dispose();
            }
            SampleGrids(iVar5);
LAB_0010318b:
            std::__cxx11::string::_M_dispose();
            return 0;
          }
          bVar1 = std::operator==(&command,"sample_puzzles");
          if (bVar1) {
            if (argc == 2) {
              iVar5 = -1;
            }
            else {
              std::__cxx11::string::string((string *)&local_60,argv[2],&local_61);
              iVar5 = std::__cxx11::stoll(&local_60,(size_t *)0x0,10);
              std::__cxx11::string::_M_dispose();
            }
            SamplePuzzles(iVar5);
            goto LAB_0010318b;
          }
        }
      }
    }
    psVar6 = &command;
    std::__cxx11::string::_M_dispose();
  }
  usage();
  iVar2 = printf("%.81s\n",psVar6);
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
    if (argc > 1) {
        string command(argv[1]);
        if (command == "pattern") {
            if (argc > 2) {
                uint64_t start = stoull(argv[2]);
                uint64_t limit = argc > 3 ? stoull(argv[3]) : 1u;
                ListPatterns(start, limit);
                return 0;
            }
        } else if (command == "count_grids") {
            if (argc == 4) {
                int start = stoi(argv[2]);
                int limit = stoi(argv[3]);
                CountGrids(start, limit);
                return 0;
            }
        } else if (command == "make_tables") {
            MakeTables();
            return 0;
        } else if (command == "list_grids") {
            if (argc > 2) {
                uint64_t start = stoull(argv[2]);
                uint64_t limit = argc > 3 ? stoull(argv[3]) : 1u;
                ListGrids(start, limit);
                return 0;
            }
        } else if (command == "sample_grids") {
            int64_t limit = argc > 2 ? stoll(argv[2]) : -1;
            SampleGrids(limit);
            return 0;
        } else if (command == "sample_puzzles") {
            int64_t limit = argc > 2 ? stoll(argv[2]) : -1;
            SamplePuzzles(limit);
            return 0;
        }
    }
    usage();
}